

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef expr,char *name)

{
  uintptr_t uVar1;
  string_view local_30;
  
  if (expr->_id != SwitchId) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x88d,
                  "BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef, const char *)");
  }
  if (name != (char *)0x0) {
    uVar1 = expr[1].type.id;
    wasm::Name::Name((Name *)&local_30,name);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(expr + 1),(Name)local_30);
    return (BinaryenIndex)uVar1;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x88e,"BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef, const char *)"
               );
}

Assistant:

BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef expr,
                                       const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(name);
  auto& list = static_cast<Switch*>(expression)->targets;
  auto index = list.size();
  list.push_back(name);
  return index;
}